

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void summon_char(CHAR_DATA *ch,CHAR_DATA *victim)

{
  AREA_DATA_conflict *area;
  AREA_DATA_conflict *area2;
  bool bVar1;
  int iVar2;
  
  bVar1 = is_npc(victim);
  if (!bVar1) {
    area = ch->in_room->area;
    area2 = victim->in_room->area;
    if (area != area2) {
      bVar1 = is_adjacent_area(area,area2);
      if (bVar1) {
        iVar2 = number_percent();
        if (0x46 < iVar2) goto LAB_0030a609;
      }
      iVar2 = number_percent();
      if (6 < iVar2) {
        act("The summoning of $N fails as $E escapes your grasp.",ch,(void *)0x0,victim,3);
        return;
      }
    }
  }
LAB_0030a609:
  act("$n disappears suddenly.",victim,(void *)0x0,(void *)0x0,0);
  char_from_room(victim);
  char_to_room(victim,ch->in_room);
  check_zombie_summon(victim);
  act("$n arrives suddenly.",victim,(void *)0x0,(void *)0x0,0);
  act("$n has summoned you!",ch,(void *)0x0,victim,2);
  do_look(victim,"auto");
  check_plasma_thread(victim,-1);
  bVar1 = is_npc(victim);
  if (bVar1) {
    victim->law_pass = true;
  }
  return;
}

Assistant:

void summon_char(CHAR_DATA *ch, CHAR_DATA *victim)
{
	// same area OR 36% chance in adjacent OR 6% chance if they totally got away
	if (is_npc(victim)
		|| ch->in_room->area == victim->in_room->area
		|| (is_adjacent_area(ch->in_room->area, victim->in_room->area) && number_percent() > 70) // 30% chance + 6%
		|| number_percent() < 7)
	{
		act("$n disappears suddenly.", victim, nullptr, nullptr, TO_ROOM);

		char_from_room(victim);
		char_to_room(victim, ch->in_room);

		check_zombie_summon(victim);

		act("$n arrives suddenly.", victim, nullptr, nullptr, TO_ROOM);
		act("$n has summoned you!", ch, nullptr, victim, TO_VICT);

		do_look(victim, "auto");

		check_plasma_thread(victim, -1);

		if (is_npc(victim))
			victim->law_pass = true; // summoned mobs give less xp

		return;
	}

	act("The summoning of $N fails as $E escapes your grasp.", ch, 0, victim, TO_CHAR);
}